

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.cpp
# Opt level: O0

void luaC_freeall(lua_State *L)

{
  global_State *pgVar1;
  int local_1c;
  int i;
  global_State *g;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  pgVar1->currentwhite = 'C';
  sweeplist(L,&pgVar1->rootgc,0xfffffffffffffffd);
  for (local_1c = 0; local_1c < (pgVar1->strt).size; local_1c = local_1c + 1) {
    sweeplist(L,(pgVar1->strt).hash + local_1c,0xfffffffffffffffd);
  }
  return;
}

Assistant:

void luaC_freeall (lua_State *L) {
  global_State *g = G(L);
  int i;
  g->currentwhite = WHITEBITS | bitmask(SFIXEDBIT);  /* mask to collect all elements */
  sweepwholelist(L, &g->rootgc);
  for (i = 0; i < g->strt.size; i++)  /* free all string lists */
    sweepwholelist(L, &g->strt.hash[i]);
}